

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void blend_a64_d16_mask_w32_avx2
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m256i *m0,__m256i *m1,
               __m256i *v_round_offset,__m256i *v_maxval,int shift)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  alVar1 = *m0;
  auVar3 = vpsubw_avx2((undefined1  [32])*v_maxval,(undefined1  [32])alVar1);
  alVar2 = *m1;
  auVar4 = vpsubw_avx2((undefined1  [32])*v_maxval,(undefined1  [32])alVar2);
  auVar6 = vpunpcklwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
  auVar7 = vpunpcklwd_avx2((undefined1  [32])alVar1,auVar3);
  auVar6 = vpmaddwd_avx2(auVar6,auVar7);
  auVar7 = vpunpckhwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
  auVar3 = vpunpckhwd_avx2((undefined1  [32])alVar1,auVar3);
  auVar3 = vpmaddwd_avx2(auVar7,auVar3);
  auVar7 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + 0x10),*(undefined1 (*) [32])(src1 + 0x10));
  auVar8 = vpunpcklwd_avx2((undefined1  [32])alVar2,auVar4);
  auVar7 = vpmaddwd_avx2(auVar7,auVar8);
  auVar8 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + 0x10),*(undefined1 (*) [32])(src1 + 0x10));
  alVar1 = *v_round_offset;
  auVar6 = vpsubd_avx2(auVar6,(undefined1  [32])alVar1);
  auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)shift));
  auVar5 = vpunpckhwd_avx2((undefined1  [32])alVar2,auVar4);
  auVar3 = vpsubd_avx2(auVar3,(undefined1  [32])alVar1);
  auVar4 = vpsrad_avx2(auVar3,ZEXT416((uint)shift));
  auVar3 = vpmaddwd_avx2(auVar8,auVar5);
  auVar7 = vpsubd_avx2(auVar7,(undefined1  [32])alVar1);
  auVar7 = vpsrad_avx2(auVar7,ZEXT416((uint)shift));
  auVar6 = vpackssdw_avx2(auVar6,auVar4);
  auVar3 = vpsubd_avx2(auVar3,(undefined1  [32])alVar1);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)shift));
  auVar3 = vpackssdw_avx2(auVar7,auVar3);
  auVar6 = vpackuswb_avx2(auVar6,auVar3);
  auVar6 = vpermq_avx2(auVar6,0xd8);
  *(undefined1 (*) [32])dst = auVar6;
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w32_avx2(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m256i *m0, const __m256i *m1, const __m256i *v_round_offset,
    const __m256i *v_maxval, int shift) {
  const __m256i max_minus_m0 = _mm256_sub_epi16(*v_maxval, *m0);
  const __m256i max_minus_m1 = _mm256_sub_epi16(*v_maxval, *m1);
  const __m256i s0_0 = yy_loadu_256(src0);
  const __m256i s0_1 = yy_loadu_256(src0 + 16);
  const __m256i s1_0 = yy_loadu_256(src1);
  const __m256i s1_1 = yy_loadu_256(src1 + 16);
  __m256i res0_lo = _mm256_madd_epi16(_mm256_unpacklo_epi16(s0_0, s1_0),
                                      _mm256_unpacklo_epi16(*m0, max_minus_m0));
  __m256i res0_hi = _mm256_madd_epi16(_mm256_unpackhi_epi16(s0_0, s1_0),
                                      _mm256_unpackhi_epi16(*m0, max_minus_m0));
  __m256i res1_lo = _mm256_madd_epi16(_mm256_unpacklo_epi16(s0_1, s1_1),
                                      _mm256_unpacklo_epi16(*m1, max_minus_m1));
  __m256i res1_hi = _mm256_madd_epi16(_mm256_unpackhi_epi16(s0_1, s1_1),
                                      _mm256_unpackhi_epi16(*m1, max_minus_m1));
  res0_lo =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_lo, *v_round_offset), shift);
  res0_hi =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_hi, *v_round_offset), shift);
  res1_lo =
      _mm256_srai_epi32(_mm256_sub_epi32(res1_lo, *v_round_offset), shift);
  res1_hi =
      _mm256_srai_epi32(_mm256_sub_epi32(res1_hi, *v_round_offset), shift);
  const __m256i res0 = _mm256_packs_epi32(res0_lo, res0_hi);
  const __m256i res1 = _mm256_packs_epi32(res1_lo, res1_hi);
  __m256i res = _mm256_packus_epi16(res0, res1);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  _mm256_storeu_si256((__m256i *)(dst), res);
}